

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::CombineUnions
          (cmCommandArgumentParserHelper *this,char *in1,char *in2)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  reference this_00;
  unique_ptr<char[],_std::default_delete<char[]>_> local_38;
  __array out;
  size_t len;
  char *in2_local;
  char *in1_local;
  cmCommandArgumentParserHelper *this_local;
  
  this_local = (cmCommandArgumentParserHelper *)in2;
  if ((in1 != (char *)0x0) &&
     (this_local = (cmCommandArgumentParserHelper *)in1, in2 != (char *)0x0)) {
    sVar1 = strlen(in1);
    sVar2 = strlen(in2);
    out._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)(sVar1 + 1 + sVar2);
    std::make_unique<char[]>((size_t)&local_38);
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_38);
    strcpy(pcVar3,in1);
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_38);
    strcat(pcVar3,in2);
    std::
    vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
    ::push_back(&this->Variables,&local_38);
    this_00 = std::
              vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
              ::back(&this->Variables);
    this_local = (cmCommandArgumentParserHelper *)
                 std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_38);
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::CombineUnions(const char* in1,
                                                         const char* in2)
{
  if (!in1) {
    return in2;
  }
  if (!in2) {
    return in1;
  }
  size_t len = strlen(in1) + strlen(in2) + 1;
  auto out = cm::make_unique<char[]>(len);
  strcpy(out.get(), in1);
  strcat(out.get(), in2);
  this->Variables.push_back(std::move(out));
  return this->Variables.back().get();
}